

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  String *pSVar1;
  int iVar2;
  char *pcVar3;
  uint in_ECX;
  String *this_00;
  Array<const_char_*> argv;
  Array<const_char_*> local_58;
  char *local_38;
  
  local_58._capacity = ___oflag[2];
  local_58._begin.item = (char **)0x0;
  local_58._end.item = (char **)0x0;
  pSVar1 = (String *)*___oflag;
  this_00 = (String *)___oflag[1];
  local_38 = __file;
  if (this_00 != pSVar1) {
    do {
      pcVar3 = String::operator_cast_to_char_(this_00);
      Array<const_char_*>::reserve
                (&local_58,((long)local_58._end.item - (long)local_58._begin.item >> 3) + 1);
      *local_58._end.item = pcVar3;
      local_58._end.item = local_58._end.item + 1;
      this_00 = (String *)this_00[1]._data.str;
    } while (this_00 != pSVar1);
  }
  iVar2 = open(this,local_38,(int)___oflag[2],local_58._begin.item,(ulong)in_ECX);
  if (local_58._begin.item != (char **)0x0) {
    operator_delete__(local_58._begin.item);
  }
  return iVar2;
}

Assistant:

bool Process::open(const String& executable, const List<String>& args, uint streams)
{
  Array<const char*> argv(args.size());
  for (List<String>::Iterator i = args.begin(), end = args.end(); i != end; ++i)
    argv.append((const char*)*i);
  return open(executable, (int)args.size(), (char**)(const char**)argv, streams);
}